

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeMaterial(ObjEncoder *this,FaceIndex face_id)

{
  bool bVar1;
  AttributeValueIndex AVar2;
  const_reference pvVar3;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  data;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  data_size;
  ObjEncoder *in_RDI;
  iterator mat_ptr;
  AttributeValueIndex index_id;
  PointIndex vert_index;
  int material_id;
  Mesh *in_stack_ffffffffffffffa8;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *in_stack_ffffffffffffffb0
  ;
  GeometryAttribute *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  in_stack_ffffffffffffffd0;
  uint uVar4;
  bool local_1;
  
  Mesh::face(in_stack_ffffffffffffffa8,(FaceIndex)(uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  pvVar3 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                     (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
  uVar4 = pvVar3->value_;
  AVar2 = PointAttribute::mapped_index
                    ((PointAttribute *)in_stack_ffffffffffffffa8,(uint)in_stack_ffffffffffffffb0);
  bVar1 = GeometryAttribute::ConvertValue<int>
                    (in_stack_ffffffffffffffb8,(AttributeValueIndex)(uint)((ulong)in_RDI >> 0x20),
                     (int *)in_stack_ffffffffffffffb0);
  if (bVar1) {
    if (in_RDI->current_material_id_ != 0) {
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)CONCAT44(uVar4,AVar2.value_),in_stack_ffffffffffffffd0._M_cur,
                 (size_t)in_stack_ffffffffffffffc8._M_cur);
      data._M_cur = (__node_type *)
                    std::
                    unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffffa8,(key_type *)0x1253ff);
      data_size._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffffa8);
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          *)&stack0xffffffffffffffd0,
                         (_Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          *)&stack0xffffffffffffffc8);
      if (bVar1) {
        return false;
      }
      buffer(in_RDI);
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    *)0x125452);
      std::__cxx11::string::c_str();
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    *)0x12546d);
      std::__cxx11::string::size();
      EncoderBuffer::Encode
                ((EncoderBuffer *)CONCAT44(uVar4,AVar2.value_),data._M_cur,(size_t)data_size._M_cur)
      ;
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)CONCAT44(uVar4,AVar2.value_),data._M_cur,(size_t)data_size._M_cur)
      ;
      in_RDI->current_material_id_ = 0;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ObjEncoder::EncodeMaterial(FaceIndex face_id) {
  int material_id = 0;
  // Pick the first corner, all corners of a face should have same id.
  const PointIndex vert_index = in_mesh_->face(face_id)[0];
  const AttributeValueIndex index_id(material_att_->mapped_index(vert_index));
  if (!material_att_->ConvertValue<int>(index_id, &material_id)) {
    return false;
  }

  if (material_id != current_material_id_) {
    // Update material information.
    buffer()->Encode("usemtl ", 7);
    const auto mat_ptr = material_id_to_name_.find(material_id);
    // If the material id is not found.
    if (mat_ptr == material_id_to_name_.end()) {
      return false;
    }
    buffer()->Encode(mat_ptr->second.c_str(), mat_ptr->second.size());
    buffer()->Encode("\n", 1);
    current_material_id_ = material_id;
  }
  return true;
}